

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::LdexpCaseInstance::compare
          (LdexpCaseInstance *this,void **inputs,void **outputs)

{
  const_reference pvVar1;
  ostream *poVar2;
  Hex<8UL> HVar3;
  double dVar4;
  HexFloat local_60;
  Float<unsigned_int,_8,_23,_127,_3U> local_5c;
  int local_58;
  float local_54;
  int inExp;
  deUint32 ulpDiff;
  float refOut0;
  float out0;
  int in1;
  float in0;
  int compNdx;
  deUint32 maxUlpDiff;
  int mantissaBits;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  LdexpCaseInstance *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar1 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar1->varType);
  pvVar1 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  mantissaBits = glu::VarType::getPrecision(&pvVar1->varType);
  maxUlpDiff = glu::getDataTypeScalarSize(scalarSize);
  compNdx = getMinMantissaBits(mantissaBits);
  in0 = (float)getMaxUlpDiffFromBits(compNdx);
  in1 = 0;
  while( true ) {
    if ((int)maxUlpDiff <= in1) {
      return true;
    }
    out0 = *(float *)((long)*outputs_local + (long)in1 * 4);
    refOut0 = *(float *)((long)outputs_local[1] + (long)in1 * 4);
    ulpDiff = *(deUint32 *)((long)*_precision + (long)in1 * 4);
    dVar4 = ldexp((double)(ulong)(uint)out0,(int)refOut0);
    inExp = SUB84(dVar4,0);
    local_54 = (float)getUlpDiffIgnoreZeroSign((float)ulpDiff,(float)inExp);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_5c,out0);
    local_58 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_5c);
    if ((uint)in0 < (uint)local_54) break;
    in1 = in1 + 1;
  }
  poVar2 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                           "Expected [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in1);
  poVar2 = std::operator<<(poVar2,"] = ");
  HexFloat::HexFloat(&local_60,(float)inExp);
  poVar2 = anon_unknown_0::operator<<(poVar2,&local_60);
  poVar2 = std::operator<<(poVar2,", (exp = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_58);
  poVar2 = std::operator<<(poVar2,") with ULP threshold ");
  HVar3 = tcu::toHex<unsigned_int>((uint)in0);
  poVar2 = tcu::Format::operator<<(poVar2,HVar3);
  poVar2 = std::operator<<(poVar2,", got ULP diff ");
  HVar3 = tcu::toHex<unsigned_int>((uint)local_54);
  tcu::Format::operator<<(poVar2,HVar3);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const int		in1			= ((const int*)inputs[1])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		refOut0		= ldexp(in0, in1);
			const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, refOut0);

			const int		inExp		= tcu::Float32(in0).exponent();

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", (exp = " << inExp << ") with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}